

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

void update_invert_loop(IT_CHANNEL *channel,IT_SAMPLE *sample)

{
  uchar *puVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  puVar1 = &channel->inv_loop_delay;
  *puVar1 = *puVar1 + ""[channel->inv_loop_speed];
  if (((((char)*puVar1 < '\0') && (channel->inv_loop_delay = '\0', sample != (IT_SAMPLE *)0x0)) &&
      ((sample->flags & 0x17) == 0x11)) &&
     (iVar3 = sample->loop_end - sample->loop_start, 3 < iVar3)) {
    iVar4 = channel->inv_loop_offset + 1;
    iVar5 = 0;
    if (iVar4 < iVar3) {
      iVar5 = iVar4;
    }
    channel->inv_loop_offset = iVar5;
    pbVar2 = (byte *)((long)sample->data + (long)iVar5 + (long)sample->loop_start);
    *pbVar2 = ~*pbVar2;
    return;
  }
  return;
}

Assistant:

static void update_invert_loop(IT_CHANNEL *channel, IT_SAMPLE *sample)
{
	channel->inv_loop_delay += pt_tab_invloop[channel->inv_loop_speed];
	if (channel->inv_loop_delay >= 0x80)
	{
		channel->inv_loop_delay = 0;

		if (sample && ((sample->flags & (IT_SAMPLE_EXISTS | IT_SAMPLE_LOOP)) == (IT_SAMPLE_EXISTS | IT_SAMPLE_LOOP)) && !(sample->flags & (IT_SAMPLE_STEREO | IT_SAMPLE_16BIT)))
		{
			if (sample->loop_end - sample->loop_start >= 4)
			{
				channel->inv_loop_offset++;
				if (channel->inv_loop_offset >= (sample->loop_end - sample->loop_start)) channel->inv_loop_offset = 0;

				((char *)sample->data)[sample->loop_start + channel->inv_loop_offset] ^= 0xFF;
			}
		}
	}
}